

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O1

void Imath_3_2::extractEuler<float>(Matrix33<float> *mat,float *rot)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  uVar1 = *(undefined8 *)mat->x[0];
  uVar2 = *(undefined8 *)mat->x[1];
  fVar6 = (float)uVar2;
  fVar8 = (float)((ulong)uVar2 >> 0x20);
  fVar4 = (float)uVar1;
  fVar3 = (float)((ulong)uVar1 >> 0x20);
  fVar5 = fVar4 * fVar4 + fVar3 * fVar3;
  if (fVar5 < 2.3509887e-38) {
    fVar7 = ABS(fVar4);
    fVar3 = ABS(fVar3);
    fVar9 = fVar3;
    if (fVar3 <= fVar7) {
      fVar9 = fVar7;
    }
    fVar5 = 0.0;
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      fVar5 = (fVar7 / fVar9) * (fVar7 / fVar9) + (fVar3 / fVar9) * (fVar3 / fVar9);
      if (fVar5 < 0.0) {
        fVar5 = sqrtf(fVar5);
      }
      else {
        fVar5 = SQRT(fVar5);
      }
      fVar5 = fVar9 * fVar5;
    }
  }
  else if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar3 = fVar6 * fVar6 + fVar8 * fVar8;
  if (fVar3 < 2.3509887e-38) {
    fVar7 = ABS(fVar6);
    fVar8 = ABS(fVar8);
    fVar9 = fVar8;
    if (fVar8 <= fVar7) {
      fVar9 = fVar7;
    }
    fVar3 = 0.0;
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      fVar3 = (fVar7 / fVar9) * (fVar7 / fVar9) + (fVar8 / fVar9) * (fVar8 / fVar9);
      if (fVar3 < 0.0) {
        fVar3 = sqrtf(fVar3);
      }
      else {
        fVar3 = SQRT(fVar3);
      }
      fVar3 = fVar9 * fVar3;
    }
  }
  else if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar4 = atan2f((float)(~-(uint)(fVar3 != 0.0) & (uint)fVar6 |
                        (uint)(fVar6 / fVar3) & -(uint)(fVar3 != 0.0)),
                 (float)(~-(uint)(fVar5 != 0.0) & (uint)fVar4 |
                        (uint)(fVar4 / fVar5) & -(uint)(fVar5 != 0.0)));
  *rot = -fVar4;
  return;
}

Assistant:

void
extractEuler (const Matrix33<T>& mat, T& rot)
{
    //
    // Normalize the local x and y axes to remove scaling.
    //

    Vec2<T> i (mat[0][0], mat[0][1]);
    Vec2<T> j (mat[1][0], mat[1][1]);

    i.normalize ();
    j.normalize ();

    //
    // Extract the angle, rot.
    //

    rot = -std::atan2 (j[0], i[0]);
}